

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall llbuild::core::BuildEngine::cancelBuild(BuildEngine *this)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  pointer extraout_RDX;
  iterator iVar4;
  iterator local_30;
  
  pvVar2 = this->impl;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)pvVar2 + 0x90))->__data);
  if ((*(byte *)((long)pvVar2 + 200) & 1) == 0) {
    iVar4 = llvm::
            DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
            ::begin((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
                     *)((long)pvVar2 + 0xf8));
    uVar1 = *(uint *)((long)pvVar2 + 0x108);
    lVar3 = *(long *)((long)pvVar2 + 0xf8);
    local_30 = iVar4;
    while( true ) {
      if (iVar4.Ptr == (pointer)((ulong)uVar1 * 8 + lVar3)) break;
      (*(iVar4.Ptr)->key->_vptr_CancellationDelegate[2])();
      llvm::
      DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
      ::operator++(&local_30);
      iVar4.End = extraout_RDX;
      iVar4.Ptr = local_30.Ptr;
    }
  }
  LOCK();
  *(undefined1 *)((long)pvVar2 + 200) = 1;
  UNLOCK();
  if (*(long **)((long)pvVar2 + 0xb8) != (long *)0x0) {
    (**(code **)(**(long **)((long)pvVar2 + 0xb8) + 0x18))();
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x90));
  return;
}

Assistant:

void BuildEngine::cancelBuild() {
  static_cast<BuildEngineImpl*>(impl)->cancelBuild();
}